

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::DominatorBuilder::lift_continue_block_dominator(DominatorBuilder *this)

{
  int iVar1;
  CFG *pCVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  Compiler *pCVar6;
  SPIRBlock *block_00;
  SmallVector<diligent_spirv_cross::SPIRBlock::Case,_8UL> *this_00;
  Case *pCVar7;
  SPIRFunction *pSVar8;
  Case *target;
  Case *__end3;
  Case *__begin3;
  SmallVector<diligent_spirv_cross::SPIRBlock::Case,_8UL> *__range3;
  SmallVector<diligent_spirv_cross::SPIRBlock::Case,_8UL> *cases;
  bool back_edge_dominator;
  uint32_t post_order;
  SPIRBlock *block;
  DominatorBuilder *this_local;
  
  if (this->dominator != 0) {
    pCVar6 = CFG::get_compiler(this->cfg);
    block_00 = Compiler::get<diligent_spirv_cross::SPIRBlock>(pCVar6,this->dominator);
    uVar3 = CFG::get_visit_order(this->cfg,this->dominator);
    cases._3_1_ = false;
    iVar1 = *(int *)&(block_00->super_IVariant).field_0xc;
    if (iVar1 == 1) {
      pCVar2 = this->cfg;
      uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block_00->next_block);
      uVar5 = CFG::get_visit_order(pCVar2,uVar5);
      cases._3_1_ = uVar3 < uVar5;
    }
    else if (iVar1 == 2) {
      pCVar2 = this->cfg;
      uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block_00->true_block);
      uVar5 = CFG::get_visit_order(pCVar2,uVar5);
      pCVar2 = this->cfg;
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block_00->false_block);
      uVar4 = CFG::get_visit_order(pCVar2,uVar4);
      cases._3_1_ = uVar3 < uVar4 || uVar3 < uVar5;
    }
    else if (iVar1 == 3) {
      pCVar6 = CFG::get_compiler(this->cfg);
      this_00 = Compiler::get_case_list(pCVar6,block_00);
      __end3 = VectorView<diligent_spirv_cross::SPIRBlock::Case>::begin
                         (&this_00->super_VectorView<diligent_spirv_cross::SPIRBlock::Case>);
      pCVar7 = VectorView<diligent_spirv_cross::SPIRBlock::Case>::end
                         (&this_00->super_VectorView<diligent_spirv_cross::SPIRBlock::Case>);
      for (; __end3 != pCVar7; __end3 = __end3 + 1) {
        pCVar2 = this->cfg;
        uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end3->block);
        uVar5 = CFG::get_visit_order(pCVar2,uVar5);
        if (uVar3 < uVar5) {
          cases._3_1_ = true;
        }
      }
      uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block_00->default_block);
      if (uVar5 != 0) {
        pCVar2 = this->cfg;
        uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block_00->default_block);
        uVar5 = CFG::get_visit_order(pCVar2,uVar5);
        if (uVar3 < uVar5) {
          cases._3_1_ = true;
        }
      }
    }
    if (cases._3_1_) {
      pSVar8 = CFG::get_function(this->cfg);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar8->entry_block);
      this->dominator = uVar3;
    }
  }
  return;
}

Assistant:

void DominatorBuilder::lift_continue_block_dominator()
{
	// It is possible for a continue block to be the dominator of a variable is only accessed inside the while block of a do-while loop.
	// We cannot safely declare variables inside a continue block, so move any variable declared
	// in a continue block to the entry block to simplify.
	// It makes very little sense for a continue block to ever be a dominator, so fall back to the simplest
	// solution.

	if (!dominator)
		return;

	auto &block = cfg.get_compiler().get<SPIRBlock>(dominator);
	auto post_order = cfg.get_visit_order(dominator);

	// If we are branching to a block with a higher post-order traversal index (continue blocks), we have a problem
	// since we cannot create sensible GLSL code for this, fallback to entry block.
	bool back_edge_dominator = false;
	switch (block.terminator)
	{
	case SPIRBlock::Direct:
		if (cfg.get_visit_order(block.next_block) > post_order)
			back_edge_dominator = true;
		break;

	case SPIRBlock::Select:
		if (cfg.get_visit_order(block.true_block) > post_order)
			back_edge_dominator = true;
		if (cfg.get_visit_order(block.false_block) > post_order)
			back_edge_dominator = true;
		break;

	case SPIRBlock::MultiSelect:
	{
		auto &cases = cfg.get_compiler().get_case_list(block);
		for (auto &target : cases)
		{
			if (cfg.get_visit_order(target.block) > post_order)
				back_edge_dominator = true;
		}
		if (block.default_block && cfg.get_visit_order(block.default_block) > post_order)
			back_edge_dominator = true;
		break;
	}

	default:
		break;
	}

	if (back_edge_dominator)
		dominator = cfg.get_function().entry_block;
}